

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ReferencedByTessellationQueryCase::iterate
          (ReferencedByTessellationQueryCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  Context *pCVar3;
  RenderContext *renderCtx;
  int iVar4;
  GLuint GVar5;
  GLenum GVar6;
  undefined4 extraout_var;
  ProgramSources *pPVar7;
  ostream *poVar8;
  TestContext *code;
  char *pcVar9;
  char *pcVar10;
  CallLogWrapper gl;
  GLsizei length_1;
  string local_538 [32];
  ScopedLogSection section_1;
  string local_510 [32];
  undefined1 local_4f0 [8];
  GLint local_4e8;
  deUint32 props [1];
  undefined4 uStack_4c4;
  GLint referenced;
  undefined4 uStack_4a4;
  GLsizei length;
  ScopedLogSection section;
  GLint referenced_1;
  GLenum local_440 [8];
  string local_420;
  undefined1 local_400 [384];
  Context *local_280 [4];
  string local_260;
  Context *local_240 [4];
  ResultCollector result;
  ProgramSources local_1d0;
  ShaderProgram program;
  
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_400," // ERROR: ",(allocator<char> *)&program);
  tcu::ResultCollector::ResultCollector(&result,pTVar2,(string *)local_400);
  std::__cxx11::string::~string((string *)local_400);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  code = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  glu::CallLogWrapper::CallLogWrapper(&gl,(Functions *)CONCAT44(extraout_var,iVar4),code->m_log);
  pCVar3 = (this->super_TestCase).m_context;
  renderCtx = pCVar3->m_renderCtx;
  memset(&local_1d0,0,0xac);
  local_1d0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_1d0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_1d0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_1d0._193_8_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props,
             "${GLSL_VERSION_DECL}\nvoid main (void)\n{\n\tgl_Position = vec4(float(gl_VertexID), float(gl_VertexID / 2), 0.0, 1.0);\n}\n"
             ,(allocator<char> *)local_400);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)&section,(_anonymous_namespace_ *)pCVar3,
             (Context *)CONCAT44(uStack_4c4,props[0]),(char *)code);
  glu::VertexSource::VertexSource((VertexSource *)local_4f0,(string *)&section);
  pPVar7 = glu::ProgramSources::operator<<(&local_1d0,(ShaderSource *)local_4f0);
  pCVar3 = (this->super_TestCase).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&referenced,
             "${GLSL_VERSION_DECL}\nlayout (location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = vec4(0.0, 1.0, 0.0, 1.0);\n}\n"
             ,(allocator<char> *)local_400);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)&length,(_anonymous_namespace_ *)pCVar3,
             (Context *)CONCAT44(uStack_4a4,referenced),(char *)code);
  glu::FragmentSource::FragmentSource((FragmentSource *)&section_1,(string *)&length);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,(ShaderSource *)&section_1);
  pCVar3 = (this->super_TestCase).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_400);
  poVar8 = std::operator<<((ostream *)local_400,
                           "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(vertices = 3) out;\nuniform highp vec4 "
                          );
  pcVar10 = "u_referenced";
  pcVar9 = "u_unreferenced";
  if (this->m_isCtrlCase != false) {
    pcVar9 = "u_referenced";
  }
  poVar8 = std::operator<<(poVar8,pcVar9);
  poVar8 = std::operator<<(poVar8,";\nvoid main (void)\n{\n\tvec4 offset = ");
  pcVar9 = "u_unreferenced";
  if (this->m_isCtrlCase != false) {
    pcVar9 = "u_referenced";
  }
  poVar8 = std::operator<<(poVar8,pcVar9);
  std::operator<<(poVar8,
                  ";\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position + offset;\n\tgl_TessLevelInner[0] = 2.8;\n\tgl_TessLevelInner[1] = 2.8;\n\tgl_TessLevelOuter[0] = 2.8;\n\tgl_TessLevelOuter[1] = 2.8;\n\tgl_TessLevelOuter[2] = 2.8;\n\tgl_TessLevelOuter[3] = 2.8;\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_400);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_420,(_anonymous_namespace_ *)pCVar3,local_240[0],(char *)code);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&length_1,&local_420);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,(ShaderSource *)&length_1);
  pCVar3 = (this->super_TestCase).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_400);
  poVar8 = std::operator<<((ostream *)local_400,
                           "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(triangles) in;\nuniform highp vec4 "
                          );
  pcVar9 = "u_referenced";
  if (this->m_isCtrlCase != false) {
    pcVar9 = "u_unreferenced";
  }
  poVar8 = std::operator<<(poVar8,pcVar9);
  poVar8 = std::operator<<(poVar8,";\nvoid main (void)\n{\n\tvec4 offset = ");
  if (this->m_isCtrlCase != false) {
    pcVar10 = "u_unreferenced";
  }
  poVar8 = std::operator<<(poVar8,pcVar10);
  std::operator<<(poVar8,
                  ";\n\tgl_Position = gl_TessCoord.x * gl_in[0].gl_Position\n\t            + gl_TessCoord.y * gl_in[1].gl_Position\n\t            + gl_TessCoord.z * gl_in[2].gl_Position\n\t            + offset;\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_400);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_260,(_anonymous_namespace_ *)pCVar3,local_280[0],(char *)code);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&referenced_1,&local_260);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,(ShaderSource *)&referenced_1);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,pPVar7);
  std::__cxx11::string::~string((string *)local_440);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)local_280);
  std::__cxx11::string::~string(local_538);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)local_240);
  std::__cxx11::string::~string(local_510);
  std::__cxx11::string::~string((string *)&length);
  std::__cxx11::string::~string((string *)&referenced);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)props);
  glu::ProgramSources::~ProgramSources(&local_1d0);
  gl.m_enableLog = true;
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  if (program.m_program.m_info.linkOk == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_400,"failed to build program",(allocator<char> *)&local_1d0);
    tcu::ResultCollector::fail(&result,(string *)local_400);
    std::__cxx11::string::~string((string *)local_400);
    goto LAB_012059ba;
  }
  props[0] = 0x9308 - this->m_isCtrlCase;
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_400,"UnreferencedUniform",(allocator<char> *)local_4f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"Unreferenced uniform u_unreferenced",
             (allocator<char> *)&section_1);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)local_400,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)local_400);
  length = 0;
  referenced = 0;
  GVar5 = glu::CallLogWrapper::glGetProgramResourceIndex
                    (&gl,program.m_program.m_program,0x92e1,"u_unreferenced");
  local_400._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_400 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"u_unreferenced resource index: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_400,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  if (GVar5 == 0xffffffff) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_400,"resourcePos was GL_INVALID_INDEX",(allocator<char> *)&local_1d0)
    ;
    tcu::ResultCollector::fail(&result,(string *)local_400);
LAB_01205711:
    std::__cxx11::string::~string((string *)local_400);
  }
  else {
    glu::CallLogWrapper::glGetProgramResourceiv
              (&gl,program.m_program.m_program,0x92e1,GVar5,1,props,1,&length,&referenced);
    local_400._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_400 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Query ");
    local_1d0.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)glu::getProgramResourcePropertyName;
    local_1d0.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = props[0];
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1d0,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", got ");
    std::ostream::operator<<(poVar1,length);
    std::operator<<((ostream *)poVar1," value(s), value[0] = ");
    local_4f0 = (undefined1  [8])glu::getBooleanName;
    local_4e8 = referenced;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_4f0,(ostream *)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_400,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    GVar6 = glu::CallLogWrapper::glGetError(&gl);
    if (GVar6 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&section_1,"Got Error ",(allocator<char> *)&local_420);
      _referenced_1 = glu::getErrorName;
      local_440[0] = GVar6;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_((string *)&length_1,&referenced_1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section_1
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&length_1
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f0
                     ,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_400,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0
                     ,"query resource");
      tcu::ResultCollector::fail(&result,(string *)local_400);
      std::__cxx11::string::~string((string *)local_400);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)local_4f0);
      std::__cxx11::string::~string((string *)&length_1);
      std::__cxx11::string::~string((string *)&section_1);
    }
    if ((length == 0) || (referenced != 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_400,"expected GL_FALSE",(allocator<char> *)&local_1d0);
      tcu::ResultCollector::fail(&result,(string *)local_400);
      goto LAB_01205711;
    }
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_400,"ReferencedUniform",(allocator<char> *)local_4f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"Referenced uniform u_referenced",(allocator<char> *)&length_1);
  tcu::ScopedLogSection::ScopedLogSection
            (&section_1,pTVar2,(string *)local_400,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)local_400);
  length_1 = 0;
  _referenced_1 = (code *)((ulong)_referenced_1 & 0xffffffff00000000);
  GVar5 = glu::CallLogWrapper::glGetProgramResourceIndex
                    (&gl,program.m_program.m_program,0x92e1,"u_referenced");
  local_400._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_400 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"u_referenced resource index: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_400,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  if (GVar5 == 0xffffffff) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_400,"resourcePos was GL_INVALID_INDEX",(allocator<char> *)&local_1d0)
    ;
    tcu::ResultCollector::fail(&result,(string *)local_400);
LAB_012059a3:
    std::__cxx11::string::~string((string *)local_400);
  }
  else {
    glu::CallLogWrapper::glGetProgramResourceiv
              (&gl,program.m_program.m_program,0x92e1,GVar5,1,props,1,&length_1,&referenced_1);
    local_400._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_400 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Query ");
    local_1d0.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)glu::getProgramResourcePropertyName;
    local_1d0.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = props[0];
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1d0,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", got ");
    std::ostream::operator<<(poVar1,length_1);
    std::operator<<((ostream *)poVar1," value(s), value[0] = ");
    local_4f0 = (undefined1  [8])glu::getBooleanName;
    local_4e8 = referenced_1;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_4f0,(ostream *)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_400,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    GVar6 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar6,"query resource",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                    ,0x1ba5);
    if ((length_1 == 0) || (referenced_1 != 1)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_400,"expected GL_TRUE",(allocator<char> *)&local_1d0);
      tcu::ResultCollector::fail(&result,(string *)local_400);
      goto LAB_012059a3;
    }
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
LAB_012059ba:
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::ShaderProgram::~ShaderProgram(&program);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  tcu::ResultCollector::~ResultCollector(&result);
  return STOP;
}

Assistant:

ReferencedByTessellationQueryCase::IterateResult ReferencedByTessellationQueryCase::iterate (void)
{
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::ShaderProgram		program	(m_context.getRenderContext(), glu::ProgramSources()
																	<< glu::VertexSource(specializeShader(m_context, getVertexSource().c_str()))
																	<< glu::FragmentSource(specializeShader(m_context, getFragmentSource().c_str()))
																	<< glu::TessellationControlSource(specializeShader(m_context, getTessCtrlSource().c_str()))
																	<< glu::TessellationEvaluationSource(specializeShader(m_context, getTessEvalSource().c_str())));

	gl.enableLogging(true);

	m_testCtx.getLog() << program;
	if (!program.isOk())
		result.fail("failed to build program");
	else
	{
		const deUint32 props[1] = { (deUint32)((m_isCtrlCase) ? (GL_REFERENCED_BY_TESS_CONTROL_SHADER) : (GL_REFERENCED_BY_TESS_EVALUATION_SHADER)) };

		{
			const tcu::ScopedLogSection section		(m_testCtx.getLog(), "UnreferencedUniform", "Unreferenced uniform u_unreferenced");
			deUint32					resourcePos;
			glw::GLsizei				length		= 0;
			glw::GLint					referenced	= 0;

			resourcePos = gl.glGetProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_unreferenced");
			m_testCtx.getLog() << tcu::TestLog::Message << "u_unreferenced resource index: " << resourcePos << tcu::TestLog::EndMessage;

			if (resourcePos == GL_INVALID_INDEX)
				result.fail("resourcePos was GL_INVALID_INDEX");
			else
			{
				gl.glGetProgramResourceiv(program.getProgram(), GL_UNIFORM, resourcePos, 1, props, 1, &length, &referenced);
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Query " << glu::getProgramResourcePropertyStr(props[0])
					<< ", got " << length << " value(s), value[0] = " << glu::getBooleanStr(referenced)
					<< tcu::TestLog::EndMessage;

				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "query resource");

				if (length == 0 || referenced != GL_FALSE)
					result.fail("expected GL_FALSE");
			}
		}

		{
			const tcu::ScopedLogSection section		(m_testCtx.getLog(), "ReferencedUniform", "Referenced uniform u_referenced");
			deUint32					resourcePos;
			glw::GLsizei				length		= 0;
			glw::GLint					referenced	= 0;

			resourcePos = gl.glGetProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_referenced");
			m_testCtx.getLog() << tcu::TestLog::Message << "u_referenced resource index: " << resourcePos << tcu::TestLog::EndMessage;

			if (resourcePos == GL_INVALID_INDEX)
				result.fail("resourcePos was GL_INVALID_INDEX");
			else
			{
				gl.glGetProgramResourceiv(program.getProgram(), GL_UNIFORM, resourcePos, 1, props, 1, &length, &referenced);
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Query " << glu::getProgramResourcePropertyStr(props[0])
					<< ", got " << length << " value(s), value[0] = " << glu::getBooleanStr(referenced)
					<< tcu::TestLog::EndMessage;

				GLU_EXPECT_NO_ERROR(gl.glGetError(), "query resource");

				if (length == 0 || referenced != GL_TRUE)
					result.fail("expected GL_TRUE");
			}
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}